

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::appendCutsToModel(HighsPostsolveStack *this,HighsInt numCuts)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  size_t i;
  size_t newNumRow;
  size_t currNumRow;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff0;
  
  local_28 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78));
  sVar2 = local_28 + (long)in_ESI;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             local_28);
  for (; local_28 != sVar2; local_28 = local_28 + 1) {
    iVar1 = *(int *)(in_RDI + 0xdc);
    *(int *)(in_RDI + 0xdc) = iVar1 + 1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),local_28);
    *pvVar3 = iVar1;
  }
  return;
}

Assistant:

void appendCutsToModel(HighsInt numCuts) {
    size_t currNumRow = origRowIndex.size();
    size_t newNumRow = currNumRow + numCuts;
    origRowIndex.resize(newNumRow);
    for (size_t i = currNumRow; i != newNumRow; ++i)
      origRowIndex[i] = origNumRow++;
  }